

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O2

void soul::ResolutionPass::ModuleInstanceResolver::resolveSpecialisationArg
               (Expression *arg,ASTObject *param)

{
  bool bVar1;
  int iVar2;
  VariableDeclaration *pVVar3;
  NamespaceAliasDeclaration *pNVar4;
  pool_ptr<soul::AST::ProcessorBase> pr;
  pool_ptr<soul::AST::UsingDeclaration> u;
  pool_ptr<soul::AST::Namespace> local_38;
  Type local_30;
  
  cast<soul::AST::UsingDeclaration,soul::AST::ASTObject>((soul *)&local_30,param);
  if (local_30._0_8_ == 0) {
    cast<soul::AST::ProcessorAliasDeclaration,soul::AST::ASTObject>((soul *)&local_30,param);
    if (local_30._0_8_ == 0) {
      cast<soul::AST::VariableDeclaration,soul::AST::ASTObject>((soul *)&local_38,param);
      if (local_38.object == (Namespace *)0x0) {
        cast<soul::AST::NamespaceAliasDeclaration,soul::AST::ASTObject>((soul *)&local_30,param);
        if (local_30._0_8_ != 0) {
          (*(arg->super_Statement).super_ASTObject._vptr_ASTObject[7])(&local_38,arg);
          pNVar4 = pool_ptr<soul::AST::NamespaceAliasDeclaration>::operator->
                             ((pool_ptr<soul::AST::NamespaceAliasDeclaration> *)&local_30);
          (pNVar4->resolvedNamespace).object = local_38.object;
          return;
        }
        throwInternalCompilerError("resolveSpecialisationArg",0x29f);
      }
      if ((arg->kind != value) ||
         (iVar2 = (*(arg->super_Statement).super_ASTObject._vptr_ASTObject[3])(arg),
         (char)iVar2 == '\0')) {
        throwInternalCompilerError("AST::isResolvedAsValue (arg)","resolveSpecialisationArg",0x290);
      }
      pVVar3 = pool_ptr<soul::AST::VariableDeclaration>::operator->
                         ((pool_ptr<soul::AST::VariableDeclaration> *)&local_38);
      bVar1 = AST::VariableDeclaration::isResolved(pVVar3);
      if (bVar1) {
        pVVar3 = pool_ptr<soul::AST::VariableDeclaration>::operator->
                           ((pool_ptr<soul::AST::VariableDeclaration> *)&local_38);
        AST::VariableDeclaration::getType(&local_30,pVVar3);
        SanityCheckPass::expectSilentCastPossible
                  (&(arg->super_Statement).super_ASTObject.context,&local_30,arg);
        RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_30.structure);
      }
      pVVar3 = pool_ptr<soul::AST::VariableDeclaration>::operator->
                         ((pool_ptr<soul::AST::VariableDeclaration> *)&local_38);
    }
    else {
      (*(arg->super_Statement).super_ASTObject._vptr_ASTObject[6])(&local_38,arg);
      arg = (Expression *)
            pool_ptr<soul::AST::ProcessorBase>::operator*
                      ((pool_ptr<soul::AST::ProcessorBase> *)&local_38);
      pVVar3 = (VariableDeclaration *)
               pool_ptr<soul::AST::ProcessorAliasDeclaration>::operator->
                         ((pool_ptr<soul::AST::ProcessorAliasDeclaration> *)&local_30);
    }
  }
  else {
    if ((arg->kind != type) ||
       (iVar2 = (*(arg->super_Statement).super_ASTObject._vptr_ASTObject[3])(arg),
       (char)iVar2 == '\0')) {
      throwInternalCompilerError("AST::isResolvedAsType (arg)","resolveSpecialisationArg",0x282);
    }
    pVVar3 = (VariableDeclaration *)
             pool_ptr<soul::AST::UsingDeclaration>::operator->
                       ((pool_ptr<soul::AST::UsingDeclaration> *)&local_30);
  }
  ((pool_ptr<soul::AST::ProcessorBase> *)&pVVar3->initialValue)->object = (ProcessorBase *)arg;
  return;
}

Assistant:

static void resolveSpecialisationArg (AST::Expression& arg, AST::ASTObject& param)
        {
            if (auto u = cast<AST::UsingDeclaration> (param))
            {
                SOUL_ASSERT (AST::isResolvedAsType (arg));
                u->targetType = arg;
                return;
            }

            if (auto pa = cast<AST::ProcessorAliasDeclaration> (param))
            {
                auto pr = arg.getAsProcessor();
                pa->resolvedProcessor = *pr;
                return;
            }

            if (auto v = cast<AST::VariableDeclaration> (param))
            {
                SOUL_ASSERT (AST::isResolvedAsValue (arg));

                if (v->isResolved())
                    SanityCheckPass::expectSilentCastPossible (arg.context, v->getType(), arg);

                v->initialValue = arg;
                return;
            }

            if (auto n = cast<AST::NamespaceAliasDeclaration> (param))
            {
                n->resolvedNamespace = arg.getAsNamespace();
                return;
            }

            SOUL_ASSERT_FALSE;
        }